

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepGetCurrentGamma(void *arkode_mem,realtype *gamma)

{
  int iVar1;
  undefined8 *in_RSI;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  
  iVar1 = arkStep_AccessStepMem
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (ARKodeARKStepMem *)0xe88116);
  if (iVar1 == 0) {
    *in_RSI = *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x90);
  }
  return iVar1;
}

Assistant:

int ARKStepGetCurrentGamma(void *arkode_mem, realtype *gamma)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  retval = arkStep_AccessStepMem(arkode_mem, NULL, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);
  *gamma = step_mem->gamma;
  return(retval);
}